

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O0

int coda_path_from_path(char *initialpath,int is_filepath,char *appendpath,char **resultpath)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  int local_44;
  int local_3c;
  int appendpath_length;
  int initialpath_length;
  char *path;
  char **resultpath_local;
  char *appendpath_local;
  int is_filepath_local;
  char *initialpath_local;
  
  sVar1 = strlen(initialpath);
  local_3c = (int)sVar1;
  if (appendpath == (char *)0x0) {
    local_44 = 0;
  }
  else {
    sVar1 = strlen(appendpath);
    local_44 = (int)sVar1;
  }
  if ((is_filepath != 0) && (0 < local_3c)) {
    while( true ) {
      bVar3 = false;
      if ((0 < local_3c) && (bVar3 = false, initialpath[local_3c + -1] != '/')) {
        bVar3 = initialpath[local_3c + -1] != '\\';
      }
      if (!bVar3) break;
      local_3c = local_3c + -1;
    }
  }
  pcVar2 = (char *)malloc((long)(local_3c + local_44 + 2));
  *resultpath = pcVar2;
  if (*resultpath == (char *)0x0) {
    coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                   ,0x1e1);
    initialpath_local._4_4_ = -1;
  }
  else {
    _appendpath_length = *resultpath;
    if (0 < local_3c) {
      memcpy(_appendpath_length,initialpath,(long)local_3c);
      _appendpath_length = _appendpath_length + local_3c;
      if (0 < local_44) {
        *_appendpath_length = '/';
        _appendpath_length = _appendpath_length + 1;
      }
    }
    if (0 < local_44) {
      memcpy(_appendpath_length,appendpath,(long)local_44);
      _appendpath_length = _appendpath_length + local_44;
    }
    *_appendpath_length = '\0';
    clean_path(*resultpath);
    initialpath_local._4_4_ = 0;
  }
  return initialpath_local._4_4_;
}

Assistant:

int coda_path_from_path(const char *initialpath, int is_filepath, const char *appendpath, char **resultpath)
{
    char *path;
    int initialpath_length;
    int appendpath_length;

    initialpath_length = (int)strlen(initialpath);
    appendpath_length = (appendpath == NULL ? 0 : (int)strlen(appendpath));

    if (is_filepath && initialpath_length > 0)
    {
        /* remove trailing parth */
        while (initialpath_length > 0 && initialpath[initialpath_length - 1] != '/' &&
               initialpath[initialpath_length - 1] != '\\')
        {
            initialpath_length--;
        }
    }

    *resultpath = malloc(initialpath_length + 1 + appendpath_length + 1);
    if (*resultpath == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }
    path = *resultpath;
    if (initialpath_length > 0)
    {
        memcpy(path, initialpath, initialpath_length);
        path += initialpath_length;
        if (appendpath_length > 0)
        {
            *path = '/';
            path++;
        }
    }
    if (appendpath_length > 0)
    {
        memcpy(path, appendpath, appendpath_length);
        path += appendpath_length;
    }
    *path = '\0';

    clean_path(*resultpath);

    return 0;
}